

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

int tr_ilg(int n)

{
  int local_10;
  int local_c;
  int local_8;
  int n_local;
  
  if ((n & 0xffff0000U) == 0) {
    if ((n & 0xff00U) == 0) {
      local_10 = lg_table[(int)(n & 0xff)];
    }
    else {
      local_10 = lg_table[(int)(n >> 8 & 0xff)] + 8;
    }
    local_c = local_10;
  }
  else {
    if ((n & 0xff000000U) == 0) {
      local_8 = lg_table[(int)(n >> 0x10 & 0xff)] + 0x10;
    }
    else {
      local_8 = lg_table[(int)(n >> 0x18 & 0xff)] + 0x18;
    }
    local_c = local_8;
  }
  return local_c;
}

Assistant:

static INLINE
int
tr_ilg(int n) {
  return (n & 0xffff0000) ?
          ((n & 0xff000000) ?
            24 + lg_table[(n >> 24) & 0xff] :
            16 + lg_table[(n >> 16) & 0xff]) :
          ((n & 0x0000ff00) ?
             8 + lg_table[(n >>  8) & 0xff] :
             0 + lg_table[(n >>  0) & 0xff]);
}